

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  iterator iVar1;
  ImportInfo *pIVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_bool>
  pVar3;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_228;
  ImportInfo local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
  local_120;
  
  if (this->Target->IsImportedTarget == true) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_228);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_120.first,config);
      std::__cxx11::string::operator=((string *)&local_228,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
            ::find(&(this->ImportInfoMap)._M_t,&local_228);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_208.Location._M_dataplus._M_p = (pointer)&local_208.Location.field_2;
      local_208.NoSOName = false;
      local_208.Multiplicity = 0;
      local_208.Location._M_string_length = 0;
      local_208.Location.field_2._M_local_buf[0] = '\0';
      local_208.SOName._M_dataplus._M_p = (pointer)&local_208.SOName.field_2;
      local_208.SOName._M_string_length = 0;
      local_208.SOName.field_2._M_local_buf[0] = '\0';
      local_208.ImportLibrary._M_dataplus._M_p = (pointer)&local_208.ImportLibrary.field_2;
      local_208.ImportLibrary._M_string_length = 0;
      local_208.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_208.Languages._M_dataplus._M_p = (pointer)&local_208.Languages.field_2;
      local_208.Languages._M_string_length = 0;
      local_208.Languages.field_2._M_local_buf[0] = '\0';
      local_208.Libraries._M_dataplus._M_p = (pointer)&local_208.Libraries.field_2;
      local_208.Libraries._M_string_length = 0;
      local_208.Libraries.field_2._M_local_buf[0] = '\0';
      local_208.LibrariesProp._M_dataplus._M_p = (pointer)&local_208.LibrariesProp.field_2;
      local_208.LibrariesProp._M_string_length = 0;
      local_208.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_208.SharedDeps._M_dataplus._M_p = (pointer)&local_208.SharedDeps.field_2;
      local_208.SharedDeps._M_string_length = 0;
      local_208.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_228,&local_208);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
                (&local_120,&local_228,&local_208);
      pVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                          *)&this->ImportInfoMap,&local_120);
      iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::~pair(&local_120);
      ImportInfo::~ImportInfo(&local_208);
    }
    if (((this->Target->TargetTypeValue == INTERFACE_LIBRARY) ||
        (iVar1._M_node[2]._M_left != (_Base_ptr)0x0)) ||
       (iVar1._M_node[4]._M_left != (_Base_ptr)0x0)) {
      pIVar2 = (ImportInfo *)(iVar1._M_node + 2);
    }
    else {
      pIVar2 = (ImportInfo *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_228);
  }
  else {
    pIVar2 = (ImportInfo *)0x0;
  }
  return pIVar2;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}